

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void Cloud_bddPrint(CloudManager *dd,CloudNode *Func)

{
  bool bVar1;
  CloudNode *bCube;
  int fFirst;
  CloudNode *Cube;
  CloudNode *Func_local;
  CloudManager *dd_local;
  
  bVar1 = true;
  if (Func == dd->zero) {
    printf("Constant 0.");
  }
  else {
    Cube = Func;
    if (Func == dd->one) {
      printf("Constant 1.");
    }
    else {
      while ((bCube = Cloud_GetOneCube(dd,Cube), bCube != (CloudNode *)0x0 && (bCube != dd->zero)))
      {
        if (bVar1) {
          bVar1 = false;
        }
        else {
          printf(" + ");
        }
        Cloud_bddPrintCube(dd,bCube);
        Cube = Cloud_bddAnd(dd,Cube,(CloudNode *)((ulong)bCube ^ 1));
      }
    }
  }
  printf("\n");
  return;
}

Assistant:

void Cloud_bddPrint( CloudManager * dd, CloudNode * Func )
{
    CloudNode * Cube;
    int fFirst = 1;

    if ( Func == dd->zero )
        printf( "Constant 0." );
    else if ( Func == dd->one )
        printf( "Constant 1." );
    else
    {
        while ( 1 )
        {
            Cube = Cloud_GetOneCube( dd, Func );
            if ( Cube == NULL || Cube == dd->zero )
                break;
            if ( fFirst )       fFirst = 0;
            else                printf( " + " );
            Cloud_bddPrintCube( dd, Cube );
            Func = Cloud_bddAnd( dd, Func, Cloud_Not(Cube) );
        } 
    }
    printf( "\n" );
}